

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O2

void __thiscall
slang::ast::TypePrinter::visit(TypePrinter *this,ScalarType *type,string_view param_2)

{
  char *begin;
  
  begin = (type->super_IntegralType).super_Type.super_Symbol.name._M_str;
  ::fmt::v9::detail::buffer<char>::append<char>
            ((buffer<char> *)
             (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,begin,
             begin + (type->super_IntegralType).super_Type.super_Symbol.name._M_len);
  if ((type->super_IntegralType).isSigned == true) {
    ::fmt::v9::detail::buffer<char>::append<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl," signed","");
    return;
  }
  return;
}

Assistant:

void TypePrinter::visit(const ScalarType& type, string_view) {
    buffer->append(type.name);
    if (type.isSigned)
        buffer->append(" signed");
}